

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dasm_x86.h
# Opt level: O2

int dasm_encode(BuildCtx *ctx,void *buffer)

{
  int iVar1;
  uint uVar2;
  dasm_State *pdVar3;
  int *piVar4;
  int *piVar5;
  char cVar6;
  uint uVar7;
  int iVar8;
  char *pcVar9;
  byte bVar10;
  int iVar11;
  long lVar12;
  uint *puVar13;
  long lVar14;
  uint *puVar15;
  byte *pbVar16;
  byte bVar17;
  uint *puVar18;
  ptrdiff_t x;
  uint *puVar19;
  int iVar20;
  uint *cp;
  byte *pbVar21;
  bool bVar22;
  
  pdVar3 = ctx->D;
  lVar14 = 0;
  cp = (uint *)buffer;
  do {
    if (pdVar3->maxsection <= lVar14) {
      return (uint)((uint *)((long)buffer + pdVar3->codesize) != cp) << 0x19;
    }
    puVar15 = (uint *)pdVar3->sections[lVar14].buf;
    iVar1 = pdVar3->sections[lVar14].pos;
    piVar4 = pdVar3->sections[lVar14].rbuf;
switchD_00105daf_caseD_fe:
    if (puVar15 != (uint *)(piVar4 + iVar1)) {
      uVar7 = *puVar15;
      puVar18 = (uint *)0x0;
      puVar15 = puVar15 + 1;
      pbVar16 = pdVar3->actionlist + (int)uVar7;
switchD_00105daf_caseD_fd:
      pbVar21 = pbVar16;
      puVar13 = puVar18;
      bVar10 = *pbVar21;
      uVar7 = 0;
      if ((byte)(bVar10 + 0x17) < 0x12) {
        uVar7 = *puVar15;
        puVar15 = puVar15 + 1;
      }
      pbVar16 = pbVar21 + 1;
      if (bVar10 - 0xe9 < 0x17) break;
      goto LAB_00106066;
    }
    lVar14 = lVar14 + 1;
  } while( true );
  cVar6 = (char)uVar7;
  iVar20 = (int)cp;
  puVar18 = cp;
  puVar19 = puVar15;
  switch((uint)bVar10) {
  case 0xe9:
    puVar18 = puVar13;
    if (puVar13 == (uint *)0x0) {
      puVar18 = cp;
    }
    puVar13 = (uint *)0x0;
    if ((*pbVar16 & 0xfe) == 0xee) {
      puVar13 = puVar18;
    }
    if (uVar7 == 0) {
      bVar10 = *(byte *)((long)puVar18 + -1);
      bVar17 = bVar10 & 7;
      if (bVar17 == 4) {
        bVar17 = (byte)*puVar18 & 7;
      }
      if (bVar17 != 5) {
        *(byte *)((long)puVar18 + -1) = bVar10 + 0x80;
        puVar18 = puVar13;
        goto switchD_00105daf_caseD_fd;
      }
    }
    else {
      if ((int)cVar6 != uVar7) break;
      bVar10 = *(byte *)((long)puVar18 + -1);
    }
    *(byte *)((long)puVar18 + -1) = bVar10 - 0x40;
    goto LAB_00106160;
  default:
    goto LAB_00106160;
  case 0xec:
    goto switchD_00105daf_caseD_ec;
  case 0xed:
    break;
  case 0xee:
    if ((int)cVar6 == uVar7) {
LAB_00106049:
      if (puVar13 == (uint *)0x0) {
        puVar13 = cp;
      }
      *(byte *)((long)puVar13 + -2) = *(byte *)((long)puVar13 + -2) + 2;
      puVar13 = (uint *)0x0;
      goto LAB_00106160;
    }
    puVar13 = (uint *)0x0;
    goto switchD_00105daf_caseD_ec;
  case 0xef:
    if ((int)cVar6 == uVar7) goto LAB_00106049;
    puVar13 = (uint *)0x0;
    break;
  case 0xf0:
    bVar10 = pbVar21[1];
    puVar18 = (uint *)((long)cp - (ulong)(bVar10 & 7));
    if (((uVar7 & 8) == 0) || (0x9f < bVar10)) {
      if ((uVar7 & 0x10) != 0) {
        if ((char)(byte)*puVar18 < '\0') {
          *(byte *)puVar18 = 0xc5;
          *(byte *)((long)puVar18 + 1) =
               *(byte *)((long)puVar18 + 1) & 0x80 | *(byte *)((long)puVar18 + 2);
          puVar18 = (uint *)((long)puVar18 + 2);
        }
        while (puVar19 = (uint *)((long)puVar18 + 1), puVar19 < cp) {
          *(byte *)puVar18 = *(byte *)puVar19;
          puVar18 = puVar19;
        }
        if (puVar13 != (uint *)0x0) {
          puVar13 = (uint *)((long)puVar13 + -1);
        }
        cp = (uint *)((long)cp + -1);
        uVar7 = uVar7 & 7;
      }
      if (bVar10 < 0xc0) goto LAB_00106181;
      uVar7 = uVar7 << 4;
    }
    else {
      if ((char)(byte)*puVar18 < '\0') {
        *(byte *)((long)puVar18 + 1) = *(byte *)((long)puVar18 + 1) ^ ' ' << (bVar10 >> 6);
      }
      else {
        *(byte *)puVar18 = (byte)*puVar18 ^ '\x01' << (bVar10 >> 6);
      }
      uVar7 = uVar7 & 7;
LAB_00106181:
      if (bVar10 < 0x40) {
        if ((uVar7 == 4) && (bVar10 < 0x20)) {
          *(byte *)((long)cp + -1) = *(byte *)((long)cp + -1) ^ 4;
          *(byte *)cp = 0x20;
          cp = (uint *)((long)cp + 1);
          uVar7 = 4;
        }
      }
      else {
        uVar7 = uVar7 << 3;
      }
    }
    *(byte *)((long)cp + -1) = *(byte *)((long)cp + -1) ^ (byte)uVar7;
    goto LAB_001061af;
  case 0xf1:
    bVar10 = *pbVar16;
    while (bVar22 = uVar7 != 0, uVar7 = uVar7 - 1, bVar22) {
      *(byte *)cp = bVar10;
      cp = (uint *)((long)cp + 1);
    }
    goto LAB_001061af;
  case 0xf2:
  case 0xf9:
    goto switchD_00105daf_caseD_f2;
  case 0xf3:
    goto LAB_00106092;
  case 0xf4:
    pbVar16 = pbVar21 + 2;
    if (-1 < (int)uVar7) goto LAB_00105f0b;
    puVar15 = puVar15 + 1;
    uVar7 = *(uint *)(pdVar3->globals + (int)(-10 - uVar7));
LAB_00106092:
    uVar7 = (uVar7 - iVar20) - 4;
    break;
  case 0xf5:
LAB_00105f0b:
    puVar19 = puVar15 + 1;
    piVar5 = pdVar3->sections[(int)uVar7 >> 0x18].rbuf;
    iVar8 = piVar5[(int)uVar7];
    if (iVar8 < 0) {
      uVar7 = piVar5[(long)(int)uVar7 + 1];
      puVar15 = puVar19;
      goto LAB_00106092;
    }
    uVar2 = *puVar15;
    uVar7 = (uVar2 + ((int)buffer - iVar20) + iVar8) - 4;
    puVar15 = puVar19;
    if (uVar2 != 0) {
      if (uVar2 == 4) {
        *(byte *)((long)cp + -2) = *(byte *)((long)cp + -1) - 0x10;
        cp = (uint *)((long)cp + -1);
      }
      else {
        *(byte *)((long)cp + -1) = 0xeb;
      }
LAB_00106160:
      *(byte *)cp = (byte)uVar7;
      cp = (uint *)((long)cp + 1);
      puVar18 = puVar13;
      puVar15 = puVar19;
      goto switchD_00105daf_caseD_fd;
    }
    break;
  case 0xf6:
    pbVar16 = pbVar21 + 2;
    if (-1 < (int)uVar7) goto switchD_00105daf_caseD_f7;
    cp = (uint *)dasma_((uchar *)cp,(ptrdiff_t)pdVar3->globals[(int)(-10 - uVar7)]);
    goto LAB_001061af;
  case 0xf7:
switchD_00105daf_caseD_f7:
    piVar5 = pdVar3->sections[(int)uVar7 >> 0x18].rbuf;
    lVar12 = (long)piVar5[(int)uVar7];
    if (lVar12 < 0) {
      x = (ptrdiff_t)piVar5[(long)(int)uVar7 + 1];
    }
    else {
      x = lVar12 + (long)buffer;
    }
    cp = (uint *)dasma_((uchar *)cp,x);
    puVar18 = puVar13;
    goto switchD_00105daf_caseD_fd;
  case 0xf8:
    puVar18 = puVar13;
    pbVar16 = pbVar21 + 2;
    if (pbVar21[1] < 10) goto switchD_00105daf_caseD_fd;
    if (pbVar21[2] == 0xf2) {
      uVar7 = *puVar15;
    }
    pdVar3->globals[pbVar21[1] - 10] = (void *)((long)(int)uVar7 + (long)buffer);
    goto LAB_001061af;
  case 0xfa:
    bVar10 = *pbVar16;
    for (lVar12 = (long)cp - (long)buffer; ((uint)lVar12 & (uint)bVar10) != 0; lVar12 = lVar12 + 1)
    {
      *(byte *)cp = 0x90;
      cp = (uint *)((long)cp + 1);
    }
LAB_001061af:
    puVar18 = puVar13;
    pbVar16 = pbVar21 + 2;
    goto switchD_00105daf_caseD_fd;
  case 0xfb:
    iVar8 = ctx->nreloc;
    if (199 < iVar8) {
      fwrite("Error: too many relocations, increase BUILD_MAX_RELOC.\n",0x37,1,_stderr);
      exit(1);
    }
    bVar10 = *pbVar16;
    bVar17 = pbVar21[2];
    iVar11 = relocmap[bVar17];
    if (iVar11 < 0) {
      relocmap[bVar17] = ctx->nrelocsym;
      pcVar9 = sym_decorate(ctx,"",extnames[bVar17]);
      iVar8 = ctx->nrelocsym;
      ctx->relocsym[iVar8] = pcVar9;
      ctx->nrelocsym = iVar8 + 1;
      iVar8 = ctx->nreloc;
      iVar11 = relocmap[bVar17];
    }
    ctx->reloc[iVar8].ofs = iVar20 - *(int *)&ctx->code;
    ctx->reloc[iVar8].sym = iVar11;
    ctx->reloc[iVar8].type = (uint)bVar10;
    ctx->nreloc = iVar8 + 1;
    pbVar16 = pbVar21 + 3;
    uVar7 = 0;
    break;
  case 0xfc:
    bVar10 = pbVar21[1];
    pbVar16 = pbVar21 + 2;
LAB_00106066:
    *(byte *)cp = bVar10;
    cp = (uint *)((long)cp + 1);
    goto switchD_00105daf_caseD_f2;
  case 0xfd:
    goto switchD_00105daf_caseD_fd;
  case 0xfe:
  case 0xff:
    goto switchD_00105daf_caseD_fe;
  }
  *cp = uVar7;
  cp = cp + 1;
switchD_00105daf_caseD_f2:
  puVar18 = puVar13;
  goto switchD_00105daf_caseD_fd;
switchD_00105daf_caseD_ec:
  *(short *)cp = (short)uVar7;
  cp = (uint *)((long)cp + 2);
  goto switchD_00105daf_caseD_f2;
}

Assistant:

int dasm_encode(Dst_DECL, void *buffer)
{
  dasm_State *D = Dst_REF;
  unsigned char *base = (unsigned char *)buffer;
  unsigned char *cp = base;
  int secnum;

  /* Encode all code sections. No support for data sections (yet). */
  for (secnum = 0; secnum < D->maxsection; secnum++) {
    dasm_Section *sec = D->sections + secnum;
    int *b = sec->buf;
    int *endb = sec->rbuf + sec->pos;

    while (b != endb) {
      dasm_ActList p = D->actionlist + *b++;
      unsigned char *mark = NULL;
      while (1) {
	int action = *p++;
	int n = (action >= DASM_DISP && action <= DASM_ALIGN) ? *b++ : 0;
	switch (action) {
	case DASM_DISP: if (!mark) mark = cp; {
	  unsigned char *mm = mark;
	  if (*p != DASM_IMM_DB && *p != DASM_IMM_WB) mark = NULL;
	  if (n == 0) { int mrm = mm[-1]&7; if (mrm == 4) mrm = mm[0]&7;
	    if (mrm != 5) { mm[-1] -= 0x80; break; } }
	  if (((n+128) & -256) != 0) goto wd; else mm[-1] -= 0x40;
	}
	  /* fallthrough */
	case DASM_IMM_S: case DASM_IMM_B: wb: dasmb(n); break;
	case DASM_IMM_DB: if (((n+128)&-256) == 0) {
	    db: if (!mark) mark = cp; mark[-2] += 2; mark = NULL; goto wb;
	  } else mark = NULL;
	  /* fallthrough */
	case DASM_IMM_D: wd: dasmd(n); break;
	case DASM_IMM_WB: if (((n+128)&-256) == 0) goto db; else mark = NULL;
	  /* fallthrough */
	case DASM_IMM_W: dasmw(n); break;
	case DASM_VREG: {
	  int t = *p++;
	  unsigned char *ex = cp - (t&7);
	  if ((n & 8) && t < 0xa0) {
	    if (*ex & 0x80) ex[1] ^= 0x20 << (t>>6); else *ex ^= 1 << (t>>6);
	    n &= 7;
	  } else if (n & 0x10) {
	    if (*ex & 0x80) {
	      *ex = 0xc5; ex[1] = (ex[1] & 0x80) | ex[2]; ex += 2;
	    }
	    while (++ex < cp) ex[-1] = *ex;
	    if (mark) mark--;
	    cp--;
	    n &= 7;
	  }
	  if (t >= 0xc0) n <<= 4;
	  else if (t >= 0x40) n <<= 3;
	  else if (n == 4 && t < 0x20) { cp[-1] ^= n; *cp++ = 0x20; }
	  cp[-1] ^= n;
	  break;
	}
	case DASM_REL_LG: p++; if (n >= 0) goto rel_pc;
	  b++; n = (int)(ptrdiff_t)D->globals[-n-10];
	  /* fallthrough */
	case DASM_REL_A: rel_a:
	  n -= (unsigned int)(ptrdiff_t)(cp+4); goto wd; /* !x64 */
	case DASM_REL_PC: rel_pc: {
	  int shrink = *b++;
	  int *pb = DASM_POS2PTR(D, n); if (*pb < 0) { n = pb[1]; goto rel_a; }
	  n = *pb - ((int)(cp-base) + 4-shrink);
	  if (shrink == 0) goto wd;
	  if (shrink == 4) { cp--; cp[-1] = *cp-0x10; } else cp[-1] = 0xeb;
	  goto wb;
	}
	case DASM_IMM_LG:
	  p++;
	  if (n < 0) { dasma((ptrdiff_t)D->globals[-n-10]); break; }
	  /* fallthrough */
	case DASM_IMM_PC: {
	  int *pb = DASM_POS2PTR(D, n);
	  dasma(*pb < 0 ? (ptrdiff_t)pb[1] : (*pb + (ptrdiff_t)base));
	  break;
	}
	case DASM_LABEL_LG: {
	  int idx = *p++;
	  if (idx >= 10)
	    D->globals[idx-10] = (void *)(base + (*p == DASM_SETLABEL ? *b : n));
	  break;
	}
	case DASM_LABEL_PC: case DASM_SETLABEL: break;
	case DASM_SPACE: { int fill = *p++; while (n--) *cp++ = fill; break; }
	case DASM_ALIGN:
	  n = *p++;
	  while (((cp-base) & n)) *cp++ = 0x90; /* nop */
	  break;
	case DASM_EXTERN: n = DASM_EXTERN(Dst, cp, p[1], *p); p += 2; goto wd;
	case DASM_MARK: mark = cp; break;
	case DASM_ESC: action = *p++;
	  /* fallthrough */
	default: *cp++ = action; break;
	case DASM_SECTION: case DASM_STOP: goto stop;
	}
      }
      stop: (void)0;
    }
  }

  if (base + D->codesize != cp)  /* Check for phase errors. */
    return DASM_S_PHASE;
  return DASM_S_OK;
}